

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_kill(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  uv_exit_cb p_Var4;
  undefined8 uVar5;
  uv_process_options_t *puVar6;
  passwd *ppVar7;
  anon_union_8_2_13e1ed65_for_data aVar8;
  int *piVar9;
  ulong uVar10;
  uv_process_options_t *__ptr;
  ulong uVar11;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *unaff_R14;
  char *unaff_R15;
  uv_process_options_t *__nmemb;
  undefined1 auVar12 [16];
  int64_t eval_a;
  int64_t eval_b;
  sigset_t set;
  undefined1 auStack_9e8 [48];
  uv_handle_t *apuStack_9b8 [11];
  uv_loop_t *puStack_960;
  undefined8 auStack_7f8 [29];
  uv_stdio_container_t uStack_710;
  undefined4 uStack_700;
  undefined4 uStack_6f0;
  anon_union_8_2_13e1ed65_for_data aStack_6d8;
  long lStack_6a0;
  int iStack_698;
  int iStack_694;
  undefined1 auStack_690 [16];
  undefined8 uStack_680;
  undefined2 uStack_678;
  uv_stdio_container_t uStack_670;
  long alStack_660 [25];
  long alStack_598 [25];
  uv_exit_cb ap_Stack_4d0 [29];
  undefined1 auStack_3e8 [88];
  int iStack_390;
  anon_union_8_2_13e1ed65_for_data aStack_228;
  uv_process_options_t *puStack_220;
  long lStack_218;
  long lStack_210;
  anon_union_8_2_13e1ed65_for_data aStack_208;
  char cStack_1f1;
  long lStack_1f0;
  long lStack_1e8;
  anon_union_8_2_13e1ed65_for_data aStack_1e0;
  uv_process_options_t *puStack_1d8;
  uv_process_options_t *apuStack_1d0 [2];
  uv_process_options_t *puStack_1c0;
  cpu_set_t cStack_1b8;
  anon_union_8_2_13e1ed65_for_data aStack_130;
  char *pcStack_128;
  uv_process_options_t *puStack_120;
  code *pcStack_118;
  long lStack_110;
  long lStack_108;
  anon_union_8_2_13e1ed65_for_data aStack_100;
  long lStack_f8;
  long lStack_f0;
  anon_union_8_2_13e1ed65_for_data aStack_e8;
  long lStack_e0;
  long lStack_d8;
  char acStack_c2 [10];
  anon_union_8_2_13e1ed65_for_data aStack_b8;
  sigset_t local_88;
  
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&local_88);
  sigaddset(&local_88,0xf);
  iVar1 = pthread_sigmask(0,&local_88,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    local_88.__val[0] = 0xffffffffffffffff;
    p_Var4 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)local_88.__val[0] == p_Var4) goto LAB_001c2067;
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c2074;
    sigemptyset(&local_88);
    sigaddset(&local_88,0xf);
    iVar1 = pthread_sigmask(1,&local_88,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c2081;
    local_88.__val[0] = 0xffffffffffffffff;
    p_Var4 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)local_88.__val[0] == p_Var4) goto LAB_001c208e;
    iVar1 = uv_kill(process.pid,0);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c209b;
    iVar1 = uv_kill(process.pid,0xf);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a8;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,0);
    local_88.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)local_88.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20b5;
    local_88.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20c2;
    local_88.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20cf;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    local_88.__val[0] = 0;
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if ((uv_exit_cb)local_88.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2067:
    run_test_kill_cold_11();
LAB_001c2074:
    run_test_kill_cold_2();
LAB_001c2081:
    run_test_kill_cold_3();
LAB_001c208e:
    run_test_kill_cold_10();
LAB_001c209b:
    run_test_kill_cold_4();
LAB_001c20a8:
    run_test_kill_cold_5();
LAB_001c20b5:
    run_test_kill_cold_6();
LAB_001c20c2:
    run_test_kill_cold_7();
LAB_001c20cf:
    puVar6 = (uv_process_options_t *)&local_88;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c20f9;
  aStack_b8 = (anon_union_8_2_13e1ed65_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 != 0) {
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22b8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2114;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2120;
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22cb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22cb:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22d8;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c22d8:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22e5;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c22e5:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22f2;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c22f2:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22ff;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar7->pw_uid;
    puVar6 = &options;
    options.gid = ppVar7->pw_gid;
    unaff_R15 = "%d";
    unaff_R12 = acStack_c2;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2168;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar7->pw_uid);
    unaff_R14 = (uv_process_options_t *)&stack0xffffffffffffff34;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2183;
    snprintf((char *)unaff_R14,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)unaff_R14;
    options.flags = 3;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c21a8;
    uVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c21ba;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 == -0xd) {
      aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22bf;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_d8 = (long)iVar1;
    lStack_e0 = 0;
    if (lStack_d8 != 0) goto LAB_001c22cb;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c21e6;
    uVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c21f0;
    iVar1 = uv_run(uVar5,0);
    lStack_d8 = (long)iVar1;
    lStack_e0 = 0;
    if (lStack_d8 != 0) goto LAB_001c22d8;
    lStack_d8 = 1;
    lStack_e0 = (long)exit_cb_called;
    if (lStack_e0 != 1) goto LAB_001c22e5;
    lStack_d8 = 1;
    lStack_e0 = (long)close_cb_called;
    if (lStack_e0 != 1) goto LAB_001c22f2;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2259;
    unaff_R14 = (uv_process_options_t *)uv_default_loop();
    puVar6 = (uv_process_options_t *)0x0;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c226f;
    uv_walk(unaff_R14,close_walk_cb,0);
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2279;
    uv_run(unaff_R14,0);
    lStack_d8 = 0;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2287;
    uVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c228f;
    iVar1 = uv_loop_close(uVar5);
    lStack_e0 = (long)iVar1;
    if (lStack_d8 == lStack_e0) {
      aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1c22a5;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_e8.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2316;
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2326;
    aVar8.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar8.stream == (uv_stream_t *)0x0) goto LAB_001c24b5;
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c233a;
    iVar1 = setgid(*(__gid_t *)&(aVar8.stream)->field_0x14);
    lStack_f0 = (long)iVar1;
    lStack_f8 = 0;
    puVar6 = (uv_process_options_t *)aVar8.stream;
    if (lStack_f0 != 0) goto LAB_001c24ba;
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2360;
    iVar1 = setuid((aVar8.stream)->type);
    lStack_f0 = (long)iVar1;
    lStack_f8 = 0;
    if (lStack_f0 == 0) goto LAB_001c237e;
  }
  else {
LAB_001c237e:
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2391;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c23ae;
    uVar5 = uv_default_loop();
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c23c0;
    iVar1 = uv_spawn(uVar5,&process,&options);
    lStack_f0 = (long)iVar1;
    lStack_f8 = -1;
    if (lStack_f0 == -1) {
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c23e3;
      uVar5 = uv_default_loop();
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c23ed;
      iVar1 = uv_run(uVar5,0);
      lStack_f0 = (long)iVar1;
      lStack_f8 = 0;
      if (lStack_f0 != 0) goto LAB_001c248e;
      lStack_f0 = (long)close_cb_called;
      lStack_f8 = 0;
      if (lStack_f0 != 0) goto LAB_001c249b;
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c242f;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2443;
      uv_walk(puVar6,close_walk_cb,0);
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c244d;
      uv_run(puVar6,0);
      lStack_f0 = 0;
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c245b;
      uVar5 = uv_default_loop();
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2463;
      iVar1 = uv_loop_close(uVar5);
      lStack_f8 = (long)iVar1;
      if (lStack_f0 == lStack_f8) {
        aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c2479;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c248e;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c248e:
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c249b;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c249b:
      aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c24a8;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c24b5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24b5:
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c24ba;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ba:
    aStack_100 = (anon_union_8_2_13e1ed65_for_data)0x1c24c7;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_100.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  pcStack_118 = (code *)0x1c24de;
  aStack_100 = (anon_union_8_2_13e1ed65_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    pcStack_118 = (code *)0x1c24ee;
    aVar8.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar8.stream == (uv_stream_t *)0x0) goto LAB_001c267d;
    pcStack_118 = (code *)0x1c2502;
    iVar1 = setgid(*(__gid_t *)&(aVar8.stream)->field_0x14);
    lStack_108 = (long)iVar1;
    lStack_110 = 0;
    puVar6 = (uv_process_options_t *)aVar8.stream;
    if (lStack_108 != 0) goto LAB_001c2682;
    pcStack_118 = (code *)0x1c2528;
    iVar1 = setuid((aVar8.stream)->type);
    lStack_108 = (long)iVar1;
    lStack_110 = 0;
    if (lStack_108 == 0) goto LAB_001c2546;
  }
  else {
LAB_001c2546:
    pcStack_118 = (code *)0x1c2559;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    pcStack_118 = (code *)0x1c2576;
    uVar5 = uv_default_loop();
    pcStack_118 = (code *)0x1c2588;
    iVar1 = uv_spawn(uVar5,&process,&options);
    lStack_108 = (long)iVar1;
    lStack_110 = -1;
    if (lStack_108 == -1) {
      pcStack_118 = (code *)0x1c25ab;
      uVar5 = uv_default_loop();
      pcStack_118 = (code *)0x1c25b5;
      iVar1 = uv_run(uVar5,0);
      lStack_108 = (long)iVar1;
      lStack_110 = 0;
      if (lStack_108 != 0) goto LAB_001c2656;
      lStack_108 = (long)close_cb_called;
      lStack_110 = 0;
      if (lStack_108 != 0) goto LAB_001c2663;
      pcStack_118 = (code *)0x1c25f7;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      pcStack_118 = (code *)0x1c260b;
      uv_walk(puVar6,close_walk_cb,0);
      pcStack_118 = (code *)0x1c2615;
      uv_run(puVar6,0);
      lStack_108 = 0;
      pcStack_118 = (code *)0x1c2623;
      uVar5 = uv_default_loop();
      pcStack_118 = (code *)0x1c262b;
      iVar1 = uv_loop_close(uVar5);
      lStack_110 = (long)iVar1;
      if (lStack_108 == lStack_110) {
        pcStack_118 = (code *)0x1c2641;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      pcStack_118 = (code *)0x1c2656;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2656:
      pcStack_118 = (code *)0x1c2663;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2663:
      pcStack_118 = (code *)0x1c2670;
      run_test_spawn_setgid_fails_cold_5();
    }
    pcStack_118 = (code *)0x1c267d;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c267d:
    pcStack_118 = (code *)0x1c2682;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c2682:
    pcStack_118 = (code *)0x1c268f;
    run_test_spawn_setgid_fails_cold_1();
  }
  pcStack_118 = run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c26af;
  aStack_130 = (anon_union_8_2_13e1ed65_for_data)puVar6;
  pcStack_128 = unaff_R12;
  puStack_120 = unaff_R14;
  pcStack_118 = (code *)unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28a4;
    run_test_spawn_affinity_cold_1();
LAB_001c28a4:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28b1;
    run_test_spawn_affinity_cold_2();
LAB_001c28b1:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28be;
    run_test_spawn_affinity_cold_3();
LAB_001c28be:
    __ptr = puVar6;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28c3;
    run_test_spawn_affinity_cold_9();
LAB_001c28c3:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28c8;
    run_test_spawn_affinity_cold_4();
LAB_001c28c8:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28cd;
    run_test_spawn_affinity_cold_5();
LAB_001c28cd:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28d2;
    run_test_spawn_affinity_cold_6();
LAB_001c28d2:
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c28d7;
    run_test_spawn_affinity_cold_7();
  }
  else {
    puVar6._4_4_ = 0;
    puVar6._0_4_ = uVar3;
    cStack_1b8.__bits[0xe] = 0;
    cStack_1b8.__bits[0xf] = 0;
    cStack_1b8.__bits[0xc] = 0;
    cStack_1b8.__bits[0xd] = 0;
    cStack_1b8.__bits[10] = 0;
    cStack_1b8.__bits[0xb] = 0;
    cStack_1b8.__bits[8] = 0;
    cStack_1b8.__bits[9] = 0;
    cStack_1b8.__bits[6] = 0;
    cStack_1b8.__bits[7] = 0;
    cStack_1b8.__bits[4] = 0;
    cStack_1b8.__bits[5] = 0;
    cStack_1b8.__bits[2] = 0;
    cStack_1b8.__bits[3] = 0;
    cStack_1b8.__bits[0] = 0;
    cStack_1b8.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c26ef;
    iVar1 = sched_getaffinity(0,0x80,&cStack_1b8);
    if (iVar1 != 0) {
      aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c26f8;
      piVar9 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar9;
    }
    puStack_1d8 = (uv_process_options_t *)0x0;
    apuStack_1d0[0] = unaff_R14;
    if (unaff_R14 != (uv_process_options_t *)0x0) goto LAB_001c28a4;
    uVar11 = 1;
    if (1 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    uVar10 = 0;
    do {
      if ((uVar10 < 0x400) && ((cStack_1b8.__bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
      goto LAB_001c2748;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    uVar10 = (ulong)uVar3;
LAB_001c2748:
    unaff_R14 = (uv_process_options_t *)(uVar10 & 0xffffffff);
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puStack_1d8 = __nmemb;
    apuStack_1d0[0] = unaff_R14;
    if (__nmemb <= unaff_R14) goto LAB_001c28b1;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2784;
    snprintf((char *)apuStack_1d0,0xb,"%d",unaff_R14);
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2797;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c27a4;
    __ptr = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    if ((uv_stream_t *)__ptr == (uv_stream_t *)0x0) goto LAB_001c28be;
    *(char *)((long)&unaff_R14->exit_cb + (long)&((uv_stream_t *)__ptr)->data) = '\x01';
    unaff_R14 = &options;
    options.cpumask = (char *)__ptr;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_1d0;
    options.args[3] = "dummy";
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c27ec;
    uVar5 = uv_default_loop();
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c27fe;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 != 0) goto LAB_001c28c3;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c280b;
    uVar5 = uv_default_loop();
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2815;
    iVar1 = uv_run(uVar5,0);
    if (iVar1 != 0) goto LAB_001c28c8;
    if (exit_cb_called != 1) goto LAB_001c28cd;
    if (close_cb_called != 1) goto LAB_001c28d2;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c283f;
    free(__ptr);
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2844;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2858;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2862;
    uv_run(__ptr,0);
    puStack_1d8 = (uv_process_options_t *)0x0;
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c286f;
    uVar5 = uv_default_loop();
    aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c2877;
    iVar1 = uv_loop_close(uVar5);
    puStack_1c0 = (uv_process_options_t *)(long)iVar1;
    if (puStack_1d8 == puStack_1c0) {
      aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)0x1c288e;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_1e0.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c28ee;
  aStack_1e0 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c29ad;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29ad:
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c29b2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29b2:
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c29b7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2909;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_1f1;
    cStack_1f1 = '\0';
    options.cpumask_size = 0;
    __ptr = &options;
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c292f;
    uVar5 = uv_default_loop();
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2941;
    iVar1 = uv_spawn(uVar5,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29ad;
    if (exit_cb_called != 0) goto LAB_001c29b2;
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2954;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2968;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2972;
    uv_run(__ptr,0);
    lStack_1e8 = 0;
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2980;
    uVar5 = uv_default_loop();
    aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c2988;
    iVar1 = uv_loop_close(uVar5);
    lStack_1f0 = (long)iVar1;
    if (lStack_1e8 == lStack_1f0) {
      aStack_208 = (anon_union_8_2_13e1ed65_for_data)0x1c29a0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_208.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_220 = (uv_process_options_t *)0x1c29d9;
  aStack_208 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_220 = (uv_process_options_t *)0x1c29de;
  uVar5 = uv_default_loop();
  puStack_220 = (uv_process_options_t *)0x1c29f4;
  iVar1 = uv_spawn(uVar5,&process,&options);
  lStack_210 = (long)iVar1;
  lStack_218 = 0;
  if (lStack_210 == 0) {
    puStack_220 = (uv_process_options_t *)0x1c2a17;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2a21;
    iVar1 = uv_run(uVar5,0);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b32;
    puStack_220 = (uv_process_options_t *)0x1c2a4b;
    iVar1 = uv_is_closing(&process);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b3f;
    puStack_220 = (uv_process_options_t *)0x1c2a77;
    uv_close(&process,0);
    puStack_220 = (uv_process_options_t *)0x1c2a7c;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2a86;
    iVar1 = uv_run(uVar5,0);
    lStack_210 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_210 != 0) goto LAB_001c2b4c;
    lStack_210 = 1;
    puStack_220 = (uv_process_options_t *)0x1c2ab9;
    iVar1 = uv_is_closing(&process);
    lStack_218 = (long)iVar1;
    if (lStack_210 != lStack_218) goto LAB_001c2b59;
    puStack_220 = (uv_process_options_t *)0x1c2ad3;
    __ptr = (uv_process_options_t *)uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2ae7;
    uv_walk(__ptr,close_walk_cb,0);
    puStack_220 = (uv_process_options_t *)0x1c2af1;
    uv_run(__ptr,0);
    lStack_210 = 0;
    puStack_220 = (uv_process_options_t *)0x1c2aff;
    uVar5 = uv_default_loop();
    puStack_220 = (uv_process_options_t *)0x1c2b07;
    iVar1 = uv_loop_close(uVar5);
    lStack_218 = (long)iVar1;
    if (lStack_210 == lStack_218) {
      puStack_220 = (uv_process_options_t *)0x1c2b1d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_220 = (uv_process_options_t *)0x1c2b32;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b32:
    puStack_220 = (uv_process_options_t *)0x1c2b3f;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b3f:
    puStack_220 = (uv_process_options_t *)0x1c2b4c;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b4c:
    puStack_220 = (uv_process_options_t *)0x1c2b59;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b59:
    puStack_220 = (uv_process_options_t *)0x1c2b66;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_220 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_680 = 0x6c756e2f7665642f;
  uStack_678 = 0x6c;
  aStack_228 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  puStack_220 = unaff_R14;
  iVar1 = uv_fs_open(0,auStack_3e8,&uStack_680,2,0,0);
  ap_Stack_4d0[0] = (uv_exit_cb)(long)iVar1;
  alStack_598[0] = 0;
  if (ap_Stack_4d0[0] == (uv_exit_cb)0x0) {
    iStack_698 = iStack_390;
    init_process_options("spawn_helper8",exit_cb);
    uVar5 = uv_default_loop();
    __ptr = (uv_process_options_t *)ap_Stack_4d0;
    iVar1 = uv_pipe_init(uVar5,__ptr,0);
    alStack_598[0] = (long)iVar1;
    alStack_660[0] = 0;
    if (alStack_598[0] != 0) goto LAB_001c2e8a;
    options.stdio = &uStack_670;
    uStack_670.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_670.data.stream = (uv_stream_t *)__ptr;
    iStack_694 = dup(iStack_698);
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    alStack_598[0] = (long)iVar1;
    alStack_660[0] = 0;
    if (alStack_598[0] != 0) goto LAB_001c2e9c;
    auStack_690 = uv_buf_init(&iStack_698,4);
    iVar1 = uv_write(alStack_598,ap_Stack_4d0,auStack_690,1,write_null_cb);
    alStack_660[0] = (long)iVar1;
    if (alStack_660[0] != 0) goto LAB_001c2eae;
    auVar12 = uv_buf_init(&iStack_694,4);
    auStack_690 = auVar12;
    iVar1 = uv_write(alStack_660,ap_Stack_4d0,auStack_690,1,write_cb);
    lStack_6a0 = 0;
    if (iVar1 != 0) goto LAB_001c2ebd;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,0);
    lStack_6a0 = 0;
    if (iVar1 != 0) goto LAB_001c2ecc;
    iVar1 = uv_fs_close(0,auStack_3e8,iStack_698,0);
    lStack_6a0 = 0;
    if (iVar1 != 0) goto LAB_001c2edb;
    lStack_6a0 = (long)exit_cb_called;
    if (lStack_6a0 != 1) goto LAB_001c2eea;
    lStack_6a0 = (long)close_cb_called;
    if (lStack_6a0 != 2) goto LAB_001c2ef9;
    __ptr = (uv_process_options_t *)uv_default_loop();
    uv_walk(__ptr,close_walk_cb,0);
    uv_run(__ptr,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    lStack_6a0 = (long)iVar1;
    if (lStack_6a0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2e8a:
    run_test_spawn_fs_open_cold_2();
LAB_001c2e9c:
    run_test_spawn_fs_open_cold_3();
LAB_001c2eae:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ebd:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ecc:
    run_test_spawn_fs_open_cold_6();
LAB_001c2edb:
    run_test_spawn_fs_open_cold_7();
LAB_001c2eea:
    run_test_spawn_fs_open_cold_8();
LAB_001c2ef9:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_6a0;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_6d8 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  auStack_9e8._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_9e8 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_710;
    uStack_710.flags = UV_INHERIT_FD;
    uStack_710.data.file = auStack_9e8._16_4_;
    uStack_700 = 0;
    uStack_6f0 = 0;
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    apuStack_9b8[0] = (uv_handle_t *)(long)iVar1;
    auStack_7f8[0] = 0;
    if (apuStack_9b8[0] != (uv_handle_t *)0x0) goto LAB_001c33c5;
    uv_unref(&process);
    uVar5 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar5,auStack_7f8,0);
    apuStack_9b8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9e8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9b8[0] != (uv_handle_t *)0x0) goto LAB_001c33d7;
    iVar1 = uv_pipe_open(auStack_7f8,auStack_9e8._16_4_);
    apuStack_9b8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9e8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9b8[0] != (uv_handle_t *)0x0) goto LAB_001c33e6;
    auStack_9e8._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_7f8,on_alloc,on_read_once);
    apuStack_9b8[0] = (uv_handle_t *)(long)iVar1;
    auStack_9e8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_9b8[0] != (uv_handle_t *)0x0) goto LAB_001c33f5;
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_9b8,auStack_9e8._20_4_,auStack_9e8 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_9e8._8_8_ = SEXT48(iVar1);
    if (auStack_9e8._0_8_ != auStack_9e8._8_8_) goto LAB_001c3404;
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    auStack_9e8._8_8_ = puStack_960;
    if (puStack_960 != (uv_loop_t *)0x1) goto LAB_001c3413;
    uv_fs_req_cleanup(apuStack_9b8);
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,1);
    auStack_9e8._0_8_ = SEXT48(iVar1);
    auStack_9e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3422;
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    auStack_9e8._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_9e8._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3431;
    uv_close(auStack_7f8,close_cb);
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_9b8,auStack_9e8._20_4_,auStack_9e8 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_9e8._8_8_ = SEXT48(iVar1);
    if (auStack_9e8._0_8_ != auStack_9e8._8_8_) goto LAB_001c3440;
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    auStack_9e8._8_8_ = puStack_960;
    if (puStack_960 != (uv_loop_t *)0x1) goto LAB_001c344f;
    uv_fs_req_cleanup(apuStack_9b8);
    uVar5 = uv_default_loop();
    iVar1 = uv_timer_init(uVar5,&timer);
    auStack_9e8._0_8_ = SEXT48(iVar1);
    auStack_9e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c345e;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_9e8._0_8_ = SEXT48(iVar1);
    auStack_9e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c346d;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,1);
    if (iVar1 == 1) {
      uVar5 = uv_default_loop();
      iVar1 = uv_run(uVar5,1);
      auStack_9e8._0_8_ = SEXT48(iVar1);
      auStack_9e8._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b8;
    }
    auStack_9e8._0_8_ = (uv_loop_t *)0x1;
    auStack_9e8._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_9e8._8_8_ != (uv_loop_t *)0x1) goto LAB_001c347c;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_9e8._0_8_ = SEXT48(iVar1);
    auStack_9e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c348b;
    iVar1 = close(auStack_9e8._20_4_);
    auStack_9e8._0_8_ = SEXT48(iVar1);
    auStack_9e8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_9e8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c349a;
    auStack_9e8._20_4_ = -1;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    auStack_9e8._0_8_ = (uv_loop_t *)0x0;
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    auStack_9e8._8_8_ = SEXT48(iVar1);
    if (auStack_9e8._0_8_ == auStack_9e8._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33c5:
    run_test_closed_fd_events_cold_2();
LAB_001c33d7:
    run_test_closed_fd_events_cold_3();
LAB_001c33e6:
    run_test_closed_fd_events_cold_4();
LAB_001c33f5:
    run_test_closed_fd_events_cold_5();
LAB_001c3404:
    run_test_closed_fd_events_cold_6();
LAB_001c3413:
    run_test_closed_fd_events_cold_7();
LAB_001c3422:
    run_test_closed_fd_events_cold_8();
LAB_001c3431:
    run_test_closed_fd_events_cold_9();
LAB_001c3440:
    run_test_closed_fd_events_cold_10();
LAB_001c344f:
    run_test_closed_fd_events_cold_11();
LAB_001c345e:
    run_test_closed_fd_events_cold_12();
LAB_001c346d:
    run_test_closed_fd_events_cold_13();
LAB_001c347c:
    run_test_closed_fd_events_cold_15();
LAB_001c348b:
    run_test_closed_fd_events_cold_16();
LAB_001c349a:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34b8:
  tcp = (uv_stream_t *)auStack_9e8;
  nread = auStack_9e8 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(kill) {
  int r;

#ifdef _WIN32
  no_term_signal = 1;
#endif

  init_process_options("spawn_helper4", kill_cb);

  /* Verify that uv_spawn() resets the signal disposition. */
#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_BLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_IGN));
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_UNBLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_DFL));
#endif

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  /* Kill the process. */
  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}